

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode curl_mime_data_cb(curl_mimepart *part,curl_off_t datasize,curl_read_callback readfunc,
                          curl_seek_callback seekfunc,curl_free_callback freefunc,void *arg)

{
  if (part != (curl_mimepart *)0x0) {
    cleanup_part_content(part);
    if (readfunc != (curl_read_callback)0x0) {
      part->readfunc = readfunc;
      part->seekfunc = seekfunc;
      part->freefunc = freefunc;
      part->arg = arg;
      part->datasize = datasize;
      part->kind = MIMEKIND_CALLBACK;
    }
    return CURLE_OK;
  }
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode curl_mime_data_cb(curl_mimepart *part, curl_off_t datasize,
                           curl_read_callback readfunc,
                           curl_seek_callback seekfunc,
                           curl_free_callback freefunc, void *arg)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(readfunc) {
    part->readfunc = readfunc;
    part->seekfunc = seekfunc;
    part->freefunc = freefunc;
    part->arg = arg;
    part->datasize = datasize;
    part->kind = MIMEKIND_CALLBACK;
  }

  return CURLE_OK;
}